

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.c
# Opt level: O2

int verify_miniscript_wrapper_v(miniscript_node_t *node,miniscript_node_t *parent)

{
  if ((node->type_properties & 1) == 0) {
    return -2;
  }
  node->type_properties = node->type_properties & 0x1870c | 0x24002;
  return 0;
}

Assistant:

static int verify_miniscript_wrapper_v(struct miniscript_node_t *node, struct miniscript_node_t *parent)
{
    uint32_t x_prop = node->type_properties;
    (void)parent;

    if (!(x_prop & MINISCRIPT_TYPE_B))
        return WALLY_EINVAL;

    node->type_properties &= ~MINISCRIPT_TYPE_B;
    node->type_properties |= MINISCRIPT_TYPE_V;
    node->type_properties &= MINISCRIPT_TYPE_MASK | MINISCRIPT_PROPERTY_Z |
                             MINISCRIPT_PROPERTY_O | MINISCRIPT_PROPERTY_N |
                             MINISCRIPT_PROPERTY_M | MINISCRIPT_PROPERTY_S;
    node->type_properties |= MINISCRIPT_PROPERTY_F | MINISCRIPT_PROPERTY_X;
    return WALLY_OK;
}